

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationDataBuilder::buildContext
          (CollationDataBuilder *this,ConditionalCE32 *head,UErrorCode *errorCode)

{
  UVector *this_00;
  short sVar1;
  ushort uVar2;
  Normalizer2Impl *pNVar3;
  bool bVar4;
  byte bVar5;
  uint16_t uVar6;
  uint uVar7;
  uint uVar8;
  UChar32 UVar9;
  int32_t iVar10;
  ConditionalCE32 *pCVar11;
  char16_t *pcVar12;
  ConditionalCE32 *pCVar13;
  ConditionalCE32 *pCVar14;
  int iVar15;
  int iVar16;
  undefined8 srcChars;
  undefined4 uVar17;
  uint length;
  uint uVar18;
  uint uVar19;
  uint srcStart;
  uint uVar20;
  uint srcLength;
  ConditionalCE32 *pCVar21;
  bool bVar22;
  UnicodeString prefix;
  UnicodeString suffix;
  UCharsTrieBuilder contractionBuilder;
  UCharsTrieBuilder prefixBuilder;
  uint local_1cc;
  uint32_t local_1c8;
  uint local_19c;
  UnicodeString local_190;
  UnicodeString local_150;
  UCharsTrieBuilder local_110;
  UCharsTrieBuilder local_a0;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  UCharsTrieBuilder::UCharsTrieBuilder(&local_a0,errorCode);
  UCharsTrieBuilder::UCharsTrieBuilder(&local_110,errorCode);
  this_00 = &this->conditionalCE32s;
  pCVar14 = head;
LAB_0023c9c4:
  uVar19 = 0;
  sVar1 = (pCVar14->context).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar15 = (pCVar14->context).fUnion.fFields.fLength;
  }
  else {
    iVar15 = (int)sVar1 >> 5;
  }
  if (iVar15 == 0) {
    uVar7 = 0xffff;
  }
  else {
    if (((int)sVar1 & 2U) == 0) {
      pcVar12 = (pCVar14->context).fUnion.fFields.fArray;
    }
    else {
      pcVar12 = (pCVar14->context).fUnion.fStackFields.fBuffer;
    }
    uVar7 = (uint)(ushort)*pcVar12;
  }
  iVar15 = uVar7 + 1;
  UnicodeString::UnicodeString(&local_190,&pCVar14->context,0,iVar15);
  pCVar11 = pCVar14;
  do {
    pCVar21 = pCVar11;
    if (pCVar21->next < 0) break;
    pCVar11 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar21->next);
    if ((local_190.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      uVar17 = local_190.fUnion.fFields.fLength;
      if (-1 < local_190.fUnion.fStackFields.fLengthAndFlags) {
        uVar17 = (int)local_190.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      uVar18 = 0;
      if ((int)uVar17 < 0) {
        uVar18 = uVar17;
      }
      uVar20 = uVar17 - uVar18;
      if ((int)uVar17 <= (int)(uVar17 - uVar18)) {
        uVar20 = uVar17;
      }
      if ((int)uVar17 < 0) {
        uVar20 = uVar19;
      }
      srcChars = local_190.fUnion.fStackFields.fBuffer;
      if ((local_190.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
        srcChars = local_190.fUnion.fFields.fArray;
      }
      bVar5 = UnicodeString::doCompare(&pCVar11->context,0,uVar17,(UChar *)srcChars,uVar18,uVar20);
    }
    else {
      bVar5 = ~*(byte *)&(pCVar11->context).fUnion & 1;
    }
  } while (bVar5 == 0);
  sVar1 = (pCVar21->context).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar16 = (pCVar21->context).fUnion.fFields.fLength;
  }
  else {
    iVar16 = (int)sVar1 >> 5;
  }
  if (iVar16 != iVar15) {
    uVar2 = local_110.strings.fUnion.fStackFields.fLengthAndFlags & 1;
    local_110.strings.fUnion.fStackFields.fLengthAndFlags =
         local_110.strings.fUnion.fStackFields.fLengthAndFlags & 0x1e;
    if (uVar2 != 0) {
      local_110.strings.fUnion.fStackFields.fLengthAndFlags = 2;
    }
    local_110.elementsLength = 0;
    local_110.ucharsLength = 0;
    sVar1 = (pCVar14->context).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar16 = (pCVar14->context).fUnion.fFields.fLength;
    }
    else {
      iVar16 = (int)sVar1 >> 5;
    }
    if (iVar16 != iVar15) {
      local_1c8 = 0;
      pCVar11 = head;
      do {
        sVar1 = (pCVar11->context).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar16 = (pCVar11->context).fUnion.fFields.fLength;
        }
        else {
          iVar16 = (int)sVar1 >> 5;
        }
        if (iVar16 == 0) {
          uVar18 = 0xffff;
        }
        else {
          if (((int)sVar1 & 2U) == 0) {
            pcVar12 = (pCVar11->context).fUnion.fFields.fArray;
          }
          else {
            pcVar12 = (pCVar11->context).fUnion.fStackFields.fBuffer;
          }
          uVar18 = (uint)(ushort)*pcVar12;
        }
        if ((uVar18 != uVar7) && (pCVar11->defaultCE32 != 1)) {
          if (uVar18 != 0) {
            uVar2 = (pCVar11->context).fUnion.fStackFields.fLengthAndFlags;
            if ((uVar2 & 1) == 0) {
              uVar17 = local_190.fUnion.fFields.fLength;
              if (-1 < local_190.fUnion.fStackFields.fLengthAndFlags) {
                uVar17 = (int)local_190.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if ((short)uVar2 < 0) {
                uVar20 = (pCVar11->context).fUnion.fFields.fLength;
              }
              else {
                uVar20 = (int)(short)uVar2 >> 5;
              }
              srcStart = 1;
              if ((int)uVar20 < 1) {
                srcStart = uVar20;
              }
              uVar8 = uVar20 - srcStart;
              length = uVar18;
              if ((int)uVar8 < (int)uVar18) {
                length = uVar8;
              }
              if ((int)srcStart < 1) {
                srcStart = uVar19;
              }
              srcLength = uVar20 - srcStart;
              if ((int)length <= (int)(uVar20 - srcStart)) {
                srcLength = length;
              }
              if ((int)uVar8 < 0) {
                srcLength = uVar19;
              }
              if ((uVar2 & 2) == 0) {
                pcVar12 = (pCVar11->context).fUnion.fFields.fArray;
              }
              else {
                pcVar12 = (pCVar11->context).fUnion.fStackFields.fBuffer;
              }
              bVar5 = UnicodeString::doCompare
                                (&local_190,uVar17 - length,length,pcVar12,srcStart,srcLength);
            }
            else {
              bVar5 = ~(byte)local_190.fUnion.fStackFields.fLengthAndFlags & 1;
            }
            if (bVar5 != 0) goto LAB_0023cc0e;
          }
          local_1c8 = pCVar11->defaultCE32;
        }
LAB_0023cc0e:
        if (uVar18 == uVar7) goto LAB_0023cc28;
        pCVar11 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar11->next);
      } while( true );
    }
    local_1c8 = pCVar14->ce32;
    pCVar11 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar14->next);
    uVar19 = 0x200;
    goto LAB_0023cc3d;
  }
  local_19c = pCVar21->ce32;
  pCVar13 = pCVar21;
  goto LAB_0023cd73;
LAB_0023cc28:
  uVar19 = 0x300;
  pCVar11 = pCVar14;
LAB_0023cc3d:
  do {
    UnicodeString::UnicodeString(&local_150,&pCVar11->context,iVar15);
    pNVar3 = this->nfcImpl;
    UVar9 = UnicodeString::char32At(&local_150,0);
    uVar6 = Normalizer2Impl::getFCD16(pNVar3,UVar9);
    uVar18 = uVar19 & 0xfffffdff;
    if (0xff < uVar6) {
      uVar18 = uVar19;
    }
    uVar17 = local_150.fUnion.fFields.fLength;
    if (-1 < local_150.fUnion.fStackFields.fLengthAndFlags) {
      uVar17 = (int)local_150.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    pNVar3 = this->nfcImpl;
    UVar9 = UnicodeString::char32At(&local_150,uVar17 + -1);
    uVar6 = Normalizer2Impl::getFCD16(pNVar3,UVar9);
    uVar19 = uVar18 | 0x400;
    if (uVar6 < 0x100) {
      uVar19 = uVar18;
    }
    UCharsTrieBuilder::add(&local_110,&local_150,pCVar11->ce32,errorCode);
    pCVar13 = pCVar11;
    if (pCVar11 != pCVar21) {
      pCVar13 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar11->next);
    }
    UnicodeString::~UnicodeString(&local_150);
    bVar22 = pCVar11 != pCVar21;
    pCVar11 = pCVar13;
  } while (bVar22);
  iVar10 = addContextTrie(this,local_1c8,&local_110,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (0x7ffff < iVar10) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0023cd64;
    }
    local_19c = uVar19 | iVar10 << 0xd | 0xc9;
    bVar22 = true;
  }
  else {
LAB_0023cd64:
    bVar22 = false;
    local_1cc = 0;
  }
  if (bVar22) {
LAB_0023cd73:
    pCVar14->defaultCE32 = local_19c;
    if (uVar7 == 0) {
      if (pCVar13->next < 0) {
        bVar22 = false;
        bVar4 = false;
        local_1cc = local_19c;
        goto LAB_0023cdf2;
      }
    }
    else {
      UnicodeString::doReplace(&local_190,0,1,(UChar *)0x0,0,0);
      uVar17 = local_190.fUnion.fFields.fLength;
      if (-1 < local_190.fUnion.fStackFields.fLengthAndFlags) {
        uVar17 = (int)local_190.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doReverse(&local_190,0,uVar17);
      UCharsTrieBuilder::add(&local_a0,&local_190,local_19c,errorCode);
      if (pCVar13->next < 0) {
        bVar4 = true;
        bVar22 = false;
        goto LAB_0023cdf2;
      }
    }
    bVar22 = true;
  }
  else {
    bVar22 = false;
  }
  bVar4 = false;
LAB_0023cdf2:
  UnicodeString::~UnicodeString(&local_190);
  if (!bVar22) {
    if (bVar4) {
      iVar10 = addContextTrie(this,head->defaultCE32,&local_a0,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (iVar10 < 0x80000) {
          local_1cc = iVar10 << 0xd | 200;
        }
        else {
          local_1cc = 0;
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
      }
      else {
        local_1cc = 0;
      }
    }
    UCharsTrieBuilder::~UCharsTrieBuilder(&local_110);
    UCharsTrieBuilder::~UCharsTrieBuilder(&local_a0);
    return local_1cc;
  }
  pCVar14 = (ConditionalCE32 *)UVector::elementAt(this_00,pCVar13->next);
  goto LAB_0023c9c4;
}

Assistant:

uint32_t
CollationDataBuilder::buildContext(ConditionalCE32 *head, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // The list head must have no context.
    U_ASSERT(!head->hasContext());
    // The list head must be followed by one or more nodes that all do have context.
    U_ASSERT(head->next >= 0);
    UCharsTrieBuilder prefixBuilder(errorCode);
    UCharsTrieBuilder contractionBuilder(errorCode);
    for(ConditionalCE32 *cond = head;; cond = getConditionalCE32(cond->next)) {
        // After the list head, the prefix or suffix can be empty, but not both.
        U_ASSERT(cond == head || cond->hasContext());
        int32_t prefixLength = cond->prefixLength();
        UnicodeString prefix(cond->context, 0, prefixLength + 1);
        // Collect all contraction suffixes for one prefix.
        ConditionalCE32 *firstCond = cond;
        ConditionalCE32 *lastCond = cond;
        while(cond->next >= 0 &&
                (cond = getConditionalCE32(cond->next))->context.startsWith(prefix)) {
            lastCond = cond;
        }
        uint32_t ce32;
        int32_t suffixStart = prefixLength + 1;  // == prefix.length()
        if(lastCond->context.length() == suffixStart) {
            // One prefix without contraction suffix.
            U_ASSERT(firstCond == lastCond);
            ce32 = lastCond->ce32;
            cond = lastCond;
        } else {
            // Build the contractions trie.
            contractionBuilder.clear();
            // Entry for an empty suffix, to be stored before the trie.
            uint32_t emptySuffixCE32 = 0;
            uint32_t flags = 0;
            if(firstCond->context.length() == suffixStart) {
                // There is a mapping for the prefix and the single character c. (p|c)
                // If no other suffix matches, then we return this value.
                emptySuffixCE32 = firstCond->ce32;
                cond = getConditionalCE32(firstCond->next);
            } else {
                // There is no mapping for the prefix and just the single character.
                // (There is no p|c, only p|cd, p|ce etc.)
                flags |= Collation::CONTRACT_SINGLE_CP_NO_MATCH;
                // When the prefix matches but none of the prefix-specific suffixes,
                // then we fall back to the mappings with the next-longest prefix,
                // and ultimately to mappings with no prefix.
                // Each fallback might be another set of contractions.
                // For example, if there are mappings for ch, p|cd, p|ce, but not for p|c,
                // then in text "pch" we find the ch contraction.
                for(cond = head;; cond = getConditionalCE32(cond->next)) {
                    int32_t length = cond->prefixLength();
                    if(length == prefixLength) { break; }
                    if(cond->defaultCE32 != Collation::NO_CE32 &&
                            (length==0 || prefix.endsWith(cond->context, 1, length))) {
                        emptySuffixCE32 = cond->defaultCE32;
                    }
                }
                cond = firstCond;
            }
            // Optimization: Set a flag when
            // the first character of every contraction suffix has lccc!=0.
            // Short-circuits contraction matching when a normal letter follows.
            flags |= Collation::CONTRACT_NEXT_CCC;
            // Add all of the non-empty suffixes into the contraction trie.
            for(;;) {
                UnicodeString suffix(cond->context, suffixStart);
                uint16_t fcd16 = nfcImpl.getFCD16(suffix.char32At(0));
                if(fcd16 <= 0xff) {
                    flags &= ~Collation::CONTRACT_NEXT_CCC;
                }
                fcd16 = nfcImpl.getFCD16(suffix.char32At(suffix.length() - 1));
                if(fcd16 > 0xff) {
                    // The last suffix character has lccc!=0, allowing for discontiguous contractions.
                    flags |= Collation::CONTRACT_TRAILING_CCC;
                }
                contractionBuilder.add(suffix, (int32_t)cond->ce32, errorCode);
                if(cond == lastCond) { break; }
                cond = getConditionalCE32(cond->next);
            }
            int32_t index = addContextTrie(emptySuffixCE32, contractionBuilder, errorCode);
            if(U_FAILURE(errorCode)) { return 0; }
            if(index > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            ce32 = Collation::makeCE32FromTagAndIndex(Collation::CONTRACTION_TAG, index) | flags;
        }
        U_ASSERT(cond == lastCond);
        firstCond->defaultCE32 = ce32;
        if(prefixLength == 0) {
            if(cond->next < 0) {
                // No non-empty prefixes, only contractions.
                return ce32;
            }
        } else {
            prefix.remove(0, 1);  // Remove the length unit.
            prefix.reverse();
            prefixBuilder.add(prefix, (int32_t)ce32, errorCode);
            if(cond->next < 0) { break; }
        }
    }
    U_ASSERT(head->defaultCE32 != Collation::NO_CE32);
    int32_t index = addContextTrie(head->defaultCE32, prefixBuilder, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    return Collation::makeCE32FromTagAndIndex(Collation::PREFIX_TAG, index);
}